

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O1

optional<lambda::Parse_ast> * __thiscall
lambda::parse_from::helper::maybe_parse_term
          (optional<lambda::Parse_ast> *__return_storage_ptr__,helper *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  _Alloc_hider _Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  string local_158;
  string local_138;
  undefined1 local_118 [48];
  undefined1 local_e8 [32];
  unique_ptr<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_> local_c8 [2];
  undefined1 local_b8 [40];
  __index_type local_90;
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  local_88;
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  local_58;
  
  while( true ) {
    eat_whitespace(this);
    iVar2 = std::istream::peek();
    if (iVar2 != 0x28) break;
    std::istream::get();
    iVar2 = std::istream::peek();
    if (iVar2 != 0x2a) {
      parse_term((Parse_ast *)local_e8,this);
      get_close_paren(this);
      std::__detail::__variant::
      _Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::_Move_ctor_base((_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                         *)&local_58,
                        (_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                         *)local_e8);
      parse_from(std::istream&)::helper::parse_app_list(lambda::Parse_ast_
                ((Parse_ast *)local_118,this,(Parse_ast *)&local_58);
      std::__detail::__variant::
      _Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::_Move_ctor_base((_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                         *)__return_storage_ptr__,
                        (_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                         *)local_118);
      (__return_storage_ptr__->super__Optional_base<lambda::Parse_ast,_false,_false>)._M_payload.
      super__Optional_payload<lambda::Parse_ast,_true,_false,_false>.
      super__Optional_payload_base<lambda::Parse_ast>._M_engaged = true;
      std::__detail::__variant::
      _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::~_Variant_storage((_Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                           *)local_118);
      std::__detail::__variant::
      _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::~_Variant_storage(&local_58);
      std::__detail::__variant::
      _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::~_Variant_storage((_Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                           *)local_e8);
      return __return_storage_ptr__;
    }
    std::istream::get();
    comment(this);
  }
  if (iVar2 < 0x2f) {
    if ((iVar2 == -1) || (iVar2 == 0x29)) {
      (__return_storage_ptr__->super__Optional_base<lambda::Parse_ast,_false,_false>)._M_payload.
      super__Optional_payload<lambda::Parse_ast,_true,_false,_false>.
      super__Optional_payload_base<lambda::Parse_ast>._M_engaged = false;
      return __return_storage_ptr__;
    }
  }
  else if ((iVar2 == 0x2f) || (iVar2 == 0x5c)) {
    std::istream::get();
    parse_from(std::istream&)::helper::get_var_abi_cxx11_((string *)local_118,this);
    get_dot(this);
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_118 + 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._0_8_ == paVar1) {
      local_138.field_2._8_8_ = local_118._24_8_;
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    else {
      local_138._M_dataplus._M_p = (pointer)local_118._0_8_;
    }
    local_138.field_2._M_allocated_capacity._1_7_ = local_118._17_7_;
    local_138.field_2._M_local_buf[0] = local_118[0x10];
    local_138._M_string_length = local_118._8_8_;
    local_118._8_8_ = 0;
    local_118[0x10] = '\0';
    local_118._0_8_ = paVar1;
    parse_term((Parse_ast *)&local_88,this);
    Parse_ast::Lambda::Lambda((Lambda *)local_e8,&local_138,(Parse_ast *)&local_88);
    std::_Optional_payload_base<lambda::Parse_ast>::_Storage<lambda::Parse_ast,_false>::
    _Storage<lambda::Parse_ast::Lambda>
              ((_Storage<lambda::Parse_ast,_false> *)__return_storage_ptr__,local_e8);
    (__return_storage_ptr__->super__Optional_base<lambda::Parse_ast,_false,_false>)._M_payload.
    super__Optional_payload<lambda::Parse_ast,_true,_false,_false>.
    super__Optional_payload_base<lambda::Parse_ast>._M_engaged = true;
    std::unique_ptr<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>::~unique_ptr
              (local_c8);
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
    ::~_Variant_storage(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._0_8_ == paVar1) {
      return __return_storage_ptr__;
    }
    lVar4 = CONCAT71(local_118._17_7_,local_118[0x10]);
    _Var5._M_p = (pointer)local_118._0_8_;
    goto LAB_00102f3f;
  }
  iVar3 = isalpha(iVar2);
  if ((iVar2 != 0x5f) && (iVar3 == 0)) {
    unexpected_thing(this);
  }
  parse_from(std::istream&)::helper::get_var_abi_cxx11_(&local_158,this);
  local_b8._8_8_ = local_158._M_string_length;
  paVar1 = &local_158.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p == paVar1) {
    local_168._8_8_ = local_158.field_2._8_8_;
    local_178 = &local_168;
  }
  else {
    local_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p;
  }
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  local_b8._0_8_ = local_b8 + 0x10;
  if (local_178 == &local_168) {
    local_b8._24_8_ = local_168._8_8_;
  }
  else {
    local_b8._0_8_ = local_178;
  }
  local_168._M_allocated_capacity = (ulong)(uint7)local_158.field_2._M_allocated_capacity._1_7_ << 8
  ;
  local_90 = '\0';
  local_158._M_dataplus._M_p = (pointer)paVar1;
  parse_from(std::istream&)::helper::parse_app_list(lambda::Parse_ast_
            ((Parse_ast *)local_e8,this,(Parse_ast *)local_b8);
  std::__detail::__variant::
  _Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  ::_Move_ctor_base((_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                     *)__return_storage_ptr__,
                    (_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                     *)local_e8);
  (__return_storage_ptr__->super__Optional_base<lambda::Parse_ast,_false,_false>)._M_payload.
  super__Optional_payload<lambda::Parse_ast,_true,_false,_false>.
  super__Optional_payload_base<lambda::Parse_ast>._M_engaged = true;
  std::__detail::__variant::
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  ::~_Variant_storage((_Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                       *)local_e8);
  std::__detail::__variant::
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  ::~_Variant_storage((_Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                       *)local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p == paVar1) {
    return __return_storage_ptr__;
  }
  lVar4 = CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,local_158.field_2._M_local_buf[0]);
  _Var5._M_p = local_158._M_dataplus._M_p;
LAB_00102f3f:
  operator_delete(_Var5._M_p,lVar4 + 1);
  return __return_storage_ptr__;
}

Assistant:

std::optional<Parse_ast> maybe_parse_term() {
      eat_whitespace();
      auto ch = inp.peek();
      switch (ch) {
      case eof:
      case ')':
        return std::nullopt;
      case '/':
      case '\\': {
        inp.get();
        auto name = get_var();
        get_dot();
        return Parse_ast::Lambda(std::move(name), parse_term());
      }
      case '(': {
        inp.get();
        if (inp.peek() == '*') {
          inp.get();
          comment();
          return maybe_parse_term();
        }
        auto fst = parse_term();
        get_close_paren();
        return parse_app_list(std::move(fst));
      }
      default:
        if (std::isalpha(ch) or ch == '_') {
          return parse_app_list(Parse_ast::Variable(get_var()));
        } else {
          unexpected_thing();
        }
      }
    }